

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O2

AutoFile * __thiscall
AutoFile::operator<<
          (AutoFile *this,
          Wrapper<VectorFormatter<VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>_>,_const_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_&>
          *obj)

{
  long lVar1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *pvVar2;
  AutoFile *pAVar3;
  vector<double,_std::allocator<double>_> *extraout_RDX;
  vector<double,_std::allocator<double>_> *v;
  vector<double,_std::allocator<double>_> *extraout_RDX_00;
  value_type *elem;
  AutoFile *s;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar2 = obj->m_object;
  WriteCompactSize<AutoFile>
            (this,((long)(pvVar2->
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pvVar2->
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start) / 0x18);
  pAVar3 = (AutoFile *)
           (pvVar2->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  v = extraout_RDX;
  for (s = (AutoFile *)
           (pvVar2->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start; s != pAVar3;
      s = (AutoFile *)
          &(s->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage) {
    VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>::
    Ser<AutoFile,std::vector<double,std::allocator<double>>>
              ((VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter> *)this,s,v);
    v = extraout_RDX_00;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

AutoFile& operator<<(const T& obj)
    {
        ::Serialize(*this, obj);
        return *this;
    }